

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int *piVar5;
  Layer *pLVar6;
  void *pvVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  _func_int **pp_Var21;
  int iVar22;
  _func_int *p_Var23;
  ulong uVar24;
  Option *_elemsize;
  void *pvVar25;
  uint _w;
  int iVar26;
  int iVar27;
  Option *opt_00;
  uint uVar28;
  uint _elempack;
  long lVar29;
  int iVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  v4sf one;
  float fVar35;
  float fVar36;
  float fVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_250;
  ulong local_238;
  Mat local_208;
  ulong local_1b8;
  int local_1ac;
  Mat local_1a8;
  Mat local_158;
  ulong local_110;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  ulong local_c8;
  pointer local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  ulong local_80;
  undefined4 local_78;
  int iStack_74;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var23) != 0)) {
    iVar17 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar17;
  }
  local_1b8 = (ulong)(uint)bottom_blob->c;
  uVar24 = bottom_blob->elemsize;
  iVar17 = bottom_blob->elempack;
  iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var23);
  iVar22 = *(int *)(&this->field_0xdc + (long)p_Var23);
  iVar4 = *(int *)(&this->field_0xd8 + (long)p_Var23);
  iVar18 = *(int *)(&this->field_0xe0 + (long)p_Var23);
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)p_Var23),
             bottom_blob,&local_1a8,opt);
  iVar15 = local_1a8.w;
  iVar26 = -100;
  if ((local_1a8.data == (void *)0x0) || ((long)local_1a8.c * local_1a8.cstep == 0))
  goto LAB_003cd901;
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
  uVar8 = (long)(~((iVar30 + -1) * iVar22) + local_1a8.w) /
          (long)*(int *)(&this->field_0xe4 + (long)p_Var23);
  local_110 = uVar8 & 0xffffffff;
  iVar30 = (~((iVar4 + -1) * iVar18) + local_1a8.h) / *(int *)(&this->field_0xe8 + (long)p_Var23);
  _w = (int)uVar8 + 1;
  bVar16 = (*(uint *)(&this->field_0xd0 + (long)p_Var23) & 3) == 0 & opt->use_packing_layout;
  uVar28 = (uint)bVar16 + (uint)bVar16 * 2 + 1;
  _elemsize = (Option *)(uVar24 / (ulong)(long)iVar17 << bVar16 * '\x02');
  opt_00 = _elemsize;
  Mat::create(top_blob,_w,iVar30 + 1,(int)*(uint *)(&this->field_0xd0 + (long)p_Var23) / (int)uVar28
              ,(size_t)_elemsize,uVar28,opt->blob_allocator);
  iVar26 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003cd901;
  iVar18 = (int)local_1b8 * iVar17;
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar22 = *(int *)(&this->field_0xd0 + (long)p_Var23);
  iVar4 = *(int *)(&this->field_0x108 + (long)p_Var23);
  if ((iVar18 == iVar4) && (iVar18 == iVar22)) {
    iVar22 = iVar18;
    if (iVar17 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var23) == 3) &&
         (*(int *)(&this->field_0xd8 + (long)p_Var23) == 3)) {
        if ((*(int *)(&this->field_0xdc + (long)p_Var23) == 1) &&
           (((*(int *)(&this->field_0xe0 + (long)p_Var23) == 1 &&
             (*(int *)(&this->field_0xe4 + (long)p_Var23) == 1)) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var23) == 1)))) {
          convdw3x3s1_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                          *(Mat **)(&this->field_0x1b0 + (long)p_Var23),opt_00);
        }
        else {
          if ((((*(int *)(&this->field_0xdc + (long)p_Var23) != 1) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var23) != 1)) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var23) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var23) != 2)) goto LAB_003ccc02;
          convdw3x3s2_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                          *(Mat **)(&this->field_0x1b0 + (long)p_Var23),opt_00);
        }
LAB_003cd1ba:
        pLVar6 = this->activation;
        if (pLVar6 != (Layer *)0x0) {
          (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
        }
        goto LAB_003cd82c;
      }
    }
    else if (iVar17 == 4) {
      iVar17 = *(int *)(&this->field_0xd4 + (long)p_Var23);
      iVar22 = *(int *)(&this->field_0xd8 + (long)p_Var23);
      if (iVar17 == 5) {
        if (iVar22 == 5) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var23) == 1) &&
              (*(int *)(&this->field_0xe0 + (long)p_Var23) == 1)) &&
             ((*(int *)(&this->field_0xe4 + (long)p_Var23) == 1 &&
              (*(int *)(&this->field_0xe8 + (long)p_Var23) == 1)))) {
            convdw5x5s1_pack4_sse
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var23),opt_00);
          }
          else {
            iVar22 = 5;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var23) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var23) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var23) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var23) != 2)) goto LAB_003cd1d8;
            convdw5x5s2_pack4_sse
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var23),opt_00);
          }
          goto LAB_003cd1ba;
        }
      }
      else if ((iVar17 == 3) && (iVar22 == 3)) {
        if (((*(int *)(&this->field_0xdc + (long)p_Var23) == 1) &&
            ((*(int *)(&this->field_0xe0 + (long)p_Var23) == 1 &&
             (*(int *)(&this->field_0xe4 + (long)p_Var23) == 1)))) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var23) == 1)) {
          convdw3x3s1_pack4_sse
                    (&local_1a8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var23),opt_00);
        }
        else {
          iVar22 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var23) != 1) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var23) != 1)) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var23) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var23) != 2)) goto LAB_003cd1d8;
          convdw3x3s2_pack4_sse
                    (&local_1a8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var23),opt_00);
        }
        goto LAB_003cd1ba;
      }
LAB_003cd1d8:
      uVar28 = iVar22 * iVar17;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar28,
                 (allocator_type *)&local_208);
      pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var21[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var23)) {
        iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var23);
        iVar22 = *(int *)(&this->field_0xdc + (long)p_Var23);
        iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var23);
        iVar18 = 0;
        iVar26 = 0;
        iVar27 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var23)) {
            lVar29 = 0;
            do {
              *(int *)((long)local_158.data + (iVar26 + lVar29) * 4) = iVar27;
              p_Var23 = pp_Var21[-3];
              iVar27 = iVar27 + *(int *)(&this->field_0xdc + (long)p_Var23);
              lVar29 = lVar29 + 1;
            } while ((int)lVar29 < *(int *)(&this->field_0xd4 + (long)p_Var23));
            iVar26 = iVar26 + (int)lVar29;
          }
          iVar27 = iVar27 + (iVar15 * iVar17 - iVar22 * iVar4);
          iVar18 = iVar18 + 1;
        } while (iVar18 < *(int *)(&this->field_0xd8 + (long)p_Var23));
      }
      auVar14 = _DAT_005551e0;
      auVar13 = _DAT_005551b0;
      auVar12 = _DAT_005551a0;
      if (0 < (int)local_1b8) {
        local_1ac = uVar28 * 4;
        iVar17 = 0;
        fVar32 = (float)DAT_005551e0;
        fVar33 = DAT_005551e0._4_4_;
        fVar34 = DAT_005551e0._8_4_;
        fVar35 = DAT_005551e0._12_4_;
        local_238 = 0;
        do {
          if (-1 < iVar30) {
            pvVar25 = (void *)(top_blob->cstep * local_238 * top_blob->elemsize +
                              (long)top_blob->data);
            pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
            pvVar7 = (this->weight_data_tm).data;
            iVar22 = 0;
            do {
              if (-1 < (int)local_110) {
                uVar24 = 0;
                do {
                  p_Var23 = pp_Var21[-3];
                  if (*(int *)(&this->field_0x100 + (long)p_Var23) == 0) {
                    auVar41 = ZEXT816(0);
                  }
                  else {
                    auVar41 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var23) + local_238 * 0x10);
                  }
                  if (0 < (int)uVar28) {
                    lVar29 = 0;
                    auVar42 = auVar41;
                    do {
                      auVar45 = *(undefined1 (*) [16])
                                 ((long)local_1a8.data +
                                 (long)*(int *)((long)local_158.data + lVar29) * 0x10 +
                                 (long)(*(int *)(&this->field_0xe4 + (long)p_Var23) * (int)uVar24 *
                                       4) * 4 +
                                 (long)*(int *)(&this->field_0xe8 + (long)p_Var23) * (long)iVar22 *
                                 (long)local_1a8.w *
                                 CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) +
                                 local_1a8.cstep * local_238 *
                                 CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize));
                      pfVar1 = (float *)((long)pvVar7 + lVar29 * 4 + (long)iVar17 * 4);
                      auVar41._0_4_ = auVar42._0_4_ + *pfVar1 * auVar45._0_4_;
                      auVar41._4_4_ = auVar42._4_4_ + pfVar1[1] * auVar45._4_4_;
                      auVar41._8_4_ = auVar42._8_4_ + pfVar1[2] * auVar45._8_4_;
                      auVar41._12_4_ = auVar42._12_4_ + pfVar1[3] * auVar45._12_4_;
                      lVar29 = lVar29 + 4;
                      auVar42 = auVar41;
                    } while ((ulong)uVar28 << 2 != lVar29);
                  }
                  fVar36 = auVar41._0_4_;
                  fVar47 = auVar41._4_4_;
                  fVar43 = auVar41._8_4_;
                  fVar49 = auVar41._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var23)) {
                  case 1:
                    auVar41 = maxps(auVar41,ZEXT816(0));
                    break;
                  case 2:
                    auVar42 = maxps(auVar41,ZEXT816(0));
                    auVar45 = minps(auVar41,ZEXT816(0));
                    fVar36 = **(float **)(&this->field_0x118 + (long)p_Var23);
                    auVar41._4_4_ = fVar36 * auVar45._4_4_ + auVar42._4_4_;
                    auVar41._0_4_ = fVar36 * auVar45._0_4_ + auVar42._0_4_;
                    auVar41._8_4_ = fVar36 * auVar45._8_4_ + auVar42._8_4_;
                    auVar41._12_4_ = fVar36 * auVar45._12_4_ + auVar42._12_4_;
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var23);
                    uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var23))[1];
                    auVar39._4_4_ = uVar2;
                    auVar39._0_4_ = uVar2;
                    auVar39._8_4_ = uVar2;
                    auVar39._12_4_ = uVar2;
                    auVar41 = maxps(auVar41,auVar39);
                    auVar10._4_4_ = uVar3;
                    auVar10._0_4_ = uVar3;
                    auVar10._8_4_ = uVar3;
                    auVar10._12_4_ = uVar3;
                    auVar41 = minps(auVar41,auVar10);
                    break;
                  case 4:
                    auVar44._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
                    auVar44._8_4_ = -fVar43;
                    auVar44._12_4_ = -fVar49;
                    auVar41 = minps(auVar44,auVar12);
                    auVar41 = maxps(auVar41,auVar13);
                    fVar47 = auVar41._0_4_ * 1.442695 + 0.5;
                    fVar49 = auVar41._4_4_ * 1.442695 + 0.5;
                    fVar53 = auVar41._8_4_ * 1.442695 + 0.5;
                    fVar55 = auVar41._12_4_ * 1.442695 + 0.5;
                    fVar36 = (float)(int)fVar47;
                    fVar43 = (float)(int)fVar49;
                    fVar52 = (float)(int)fVar53;
                    fVar54 = (float)(int)fVar55;
                    fVar36 = fVar36 - (float)(-(uint)(fVar47 < fVar36) & (uint)fVar32);
                    fVar43 = fVar43 - (float)(-(uint)(fVar49 < fVar43) & (uint)fVar33);
                    fVar52 = fVar52 - (float)(-(uint)(fVar53 < fVar52) & (uint)fVar34);
                    fVar54 = fVar54 - (float)(-(uint)(fVar55 < fVar54) & (uint)fVar35);
                    fVar47 = fVar36 * -0.6931472 + auVar41._0_4_;
                    fVar49 = fVar43 * -0.6931472 + auVar41._4_4_;
                    fVar53 = fVar52 * -0.6931472 + auVar41._8_4_;
                    fVar55 = fVar54 * -0.6931472 + auVar41._12_4_;
                    auVar40._0_4_ =
                         fVar47 + fVar32 +
                         (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) *
                            fVar47 + 0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) *
                         fVar47 * fVar47;
                    auVar40._4_4_ =
                         fVar49 + fVar33 +
                         (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) *
                            fVar49 + 0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) *
                         fVar49 * fVar49;
                    auVar40._8_4_ =
                         fVar53 + fVar34 +
                         (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) *
                            fVar53 + 0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) *
                         fVar53 * fVar53;
                    auVar40._12_4_ =
                         fVar55 + fVar35 +
                         (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) *
                            fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) *
                         fVar55 * fVar55;
                    fVar53 = (float)((int)fVar36 * 0x800000 + (int)fVar32) * auVar40._0_4_ + fVar32;
                    fVar55 = (float)((int)fVar43 * 0x800000 + (int)fVar33) * auVar40._4_4_ + fVar33;
                    fVar52 = (float)((int)fVar52 * 0x800000 + (int)fVar34) * auVar40._8_4_ + fVar34;
                    fVar54 = (float)((int)fVar54 * 0x800000 + (int)fVar35) * auVar40._12_4_ + fVar35
                    ;
                    auVar9._4_4_ = fVar55;
                    auVar9._0_4_ = fVar53;
                    auVar9._8_4_ = fVar52;
                    auVar9._12_4_ = fVar54;
                    auVar41 = rcpps(auVar40,auVar9);
                    fVar36 = auVar41._0_4_;
                    fVar47 = auVar41._4_4_;
                    fVar43 = auVar41._8_4_;
                    fVar49 = auVar41._12_4_;
                    auVar41._0_4_ = (fVar32 - fVar53 * fVar36) * fVar36 + fVar36;
                    auVar41._4_4_ = (fVar33 - fVar55 * fVar47) * fVar47 + fVar47;
                    auVar41._8_4_ = (fVar34 - fVar52 * fVar43) * fVar43 + fVar43;
                    auVar41._12_4_ = (fVar35 - fVar54 * fVar49) * fVar49 + fVar49;
                    break;
                  case 5:
                    auVar41 = minps(auVar41,auVar12);
                    auVar41 = maxps(auVar41,auVar13);
                    fVar52 = auVar41._0_4_ * 1.442695 + 0.5;
                    fVar53 = auVar41._4_4_ * 1.442695 + 0.5;
                    fVar54 = auVar41._8_4_ * 1.442695 + 0.5;
                    fVar55 = auVar41._12_4_ * 1.442695 + 0.5;
                    fVar46 = (float)(int)fVar52;
                    fVar48 = (float)(int)fVar53;
                    fVar50 = (float)(int)fVar54;
                    fVar51 = (float)(int)fVar55;
                    fVar46 = fVar46 - (float)(-(uint)(fVar52 < fVar46) & (uint)fVar32);
                    fVar48 = fVar48 - (float)(-(uint)(fVar53 < fVar48) & (uint)fVar33);
                    fVar50 = fVar50 - (float)(-(uint)(fVar54 < fVar50) & (uint)fVar34);
                    fVar51 = fVar51 - (float)(-(uint)(fVar55 < fVar51) & (uint)fVar35);
                    fVar52 = auVar41._0_4_ - fVar46 * 0.6931472;
                    fVar53 = auVar41._4_4_ - fVar48 * 0.6931472;
                    fVar54 = auVar41._8_4_ - fVar50 * 0.6931472;
                    fVar55 = auVar41._12_4_ - fVar51 * 0.6931472;
                    auVar56._0_4_ =
                         (float)((int)fVar46 * 0x800000 + (int)fVar32) *
                         (fVar52 + fVar32 +
                         (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                            fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                         fVar52 * fVar52) + fVar32;
                    auVar56._4_4_ =
                         (float)((int)fVar48 * 0x800000 + (int)fVar33) *
                         (fVar53 + fVar33 +
                         (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) *
                            fVar53 + 0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) *
                         fVar53 * fVar53) + fVar33;
                    auVar56._8_4_ =
                         (float)((int)fVar50 * 0x800000 + (int)fVar34) *
                         (fVar54 + fVar34 +
                         (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) *
                            fVar54 + 0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) *
                         fVar54 * fVar54) + fVar34;
                    auVar56._12_4_ =
                         (float)((int)fVar51 * 0x800000 + (int)fVar35) *
                         (fVar55 + fVar35 +
                         (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) *
                            fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) *
                         fVar55 * fVar55) + fVar35;
                    auVar41 = maxps(auVar56,_DAT_00555250);
                    fVar52 = (float)(auVar41._0_4_ & 0x807fffff | 0x3f000000);
                    fVar54 = (float)(auVar41._4_4_ & 0x807fffff | 0x3f000000);
                    fVar46 = (float)(auVar41._8_4_ & 0x807fffff | 0x3f000000);
                    fVar50 = (float)(auVar41._12_4_ & 0x807fffff | 0x3f000000);
                    fVar53 = fVar52 + -1.0 + (float)(-(uint)(fVar52 < 0.70710677) & (uint)fVar52);
                    fVar55 = fVar54 + -1.0 + (float)(-(uint)(fVar54 < 0.70710677) & (uint)fVar54);
                    fVar48 = fVar46 + -1.0 + (float)(-(uint)(fVar46 < 0.70710677) & (uint)fVar46);
                    fVar51 = fVar50 + -1.0 + (float)(-(uint)(fVar50 < 0.70710677) & (uint)fVar50);
                    auVar37._0_8_ =
                         CONCAT44(-(uint)(auVar56._4_4_ <= 0.0),-(uint)(auVar56._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar37._8_4_ = -(uint)(auVar56._8_4_ <= 0.0) & 0x7fffffff;
                    auVar37._12_4_ = -(uint)(auVar56._12_4_ <= 0.0) & 0x7fffffff;
                    auVar45._4_4_ =
                         ~-(uint)(auVar56._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar41._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar54 < 0.70710677) & (uint)fVar33)) * 0.6931472 +
                                 fVar55 + (((((((((fVar55 * 0.070376836 + -0.1151461) * fVar55 +
                                                 0.116769984) * fVar55 + -0.12420141) * fVar55 +
                                               0.14249323) * fVar55 + -0.16668057) * fVar55 +
                                             0.20000714) * fVar55 + -0.24999994) * fVar55 +
                                           0.3333333) * fVar55 + -0.5) * fVar55 * fVar55) * -2.0);
                    auVar45._0_4_ =
                         ~-(uint)(auVar56._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar41._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar52 < 0.70710677) & (uint)fVar32)) * 0.6931472 +
                                 fVar53 + (((((((((fVar53 * 0.070376836 + -0.1151461) * fVar53 +
                                                 0.116769984) * fVar53 + -0.12420141) * fVar53 +
                                               0.14249323) * fVar53 + -0.16668057) * fVar53 +
                                             0.20000714) * fVar53 + -0.24999994) * fVar53 +
                                           0.3333333) * fVar53 + -0.5) * fVar53 * fVar53) * -2.0);
                    auVar45._8_4_ =
                         ~-(uint)(auVar56._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar41._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar46 < 0.70710677) & (uint)fVar34)) * 0.6931472 +
                                 fVar48 + (((((((((fVar48 * 0.070376836 + -0.1151461) * fVar48 +
                                                 0.116769984) * fVar48 + -0.12420141) * fVar48 +
                                               0.14249323) * fVar48 + -0.16668057) * fVar48 +
                                             0.20000714) * fVar48 + -0.24999994) * fVar48 +
                                           0.3333333) * fVar48 + -0.5) * fVar48 * fVar48) * -2.0);
                    auVar45._12_4_ =
                         ~-(uint)(auVar56._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar41._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar50 < 0.70710677) & (uint)fVar35)) * 0.6931472 +
                                 fVar51 + (((((((((fVar51 * 0.070376836 + -0.1151461) * fVar51 +
                                                 0.116769984) * fVar51 + -0.12420141) * fVar51 +
                                               0.14249323) * fVar51 + -0.16668057) * fVar51 +
                                             0.20000714) * fVar51 + -0.24999994) * fVar51 +
                                           0.3333333) * fVar51 + -0.5) * fVar51 * fVar51) * -2.0);
                    auVar41 = minps(auVar37 | auVar45,auVar12);
                    auVar41 = maxps(auVar41,auVar13);
                    fVar52 = auVar41._0_4_ * 1.442695 + 0.5;
                    fVar53 = auVar41._4_4_ * 1.442695 + 0.5;
                    fVar54 = auVar41._8_4_ * 1.442695 + 0.5;
                    fVar55 = auVar41._12_4_ * 1.442695 + 0.5;
                    fVar46 = (float)(int)fVar52;
                    fVar48 = (float)(int)fVar53;
                    fVar50 = (float)(int)fVar54;
                    fVar51 = (float)(int)fVar55;
                    fVar46 = fVar46 - (float)(-(uint)(fVar52 < fVar46) & (uint)fVar32);
                    fVar48 = fVar48 - (float)(-(uint)(fVar53 < fVar48) & (uint)fVar33);
                    fVar50 = fVar50 - (float)(-(uint)(fVar54 < fVar50) & (uint)fVar34);
                    fVar51 = fVar51 - (float)(-(uint)(fVar55 < fVar51) & (uint)fVar35);
                    fVar52 = auVar41._0_4_ - fVar46 * 0.6931472;
                    fVar53 = auVar41._4_4_ - fVar48 * 0.6931472;
                    fVar54 = auVar41._8_4_ - fVar50 * 0.6931472;
                    fVar55 = auVar41._12_4_ - fVar51 * 0.6931472;
                    auVar38._0_4_ =
                         fVar52 + fVar32 +
                         (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                            fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                         fVar52 * fVar52;
                    auVar38._4_4_ =
                         fVar53 + fVar33 +
                         (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) *
                            fVar53 + 0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) *
                         fVar53 * fVar53;
                    auVar38._8_4_ =
                         fVar54 + fVar34 +
                         (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) *
                            fVar54 + 0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) *
                         fVar54 * fVar54;
                    auVar38._12_4_ =
                         fVar55 + fVar35 +
                         (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) *
                            fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) *
                         fVar55 * fVar55;
                    fVar46 = (float)((int)fVar46 * 0x800000 + (int)fVar32) * auVar38._0_4_ + fVar32;
                    fVar48 = (float)((int)fVar48 * 0x800000 + (int)fVar33) * auVar38._4_4_ + fVar33;
                    fVar50 = (float)((int)fVar50 * 0x800000 + (int)fVar34) * auVar38._8_4_ + fVar34;
                    fVar51 = (float)((int)fVar51 * 0x800000 + (int)fVar35) * auVar38._12_4_ + fVar35
                    ;
                    auVar11._4_4_ = fVar48;
                    auVar11._0_4_ = fVar46;
                    auVar11._8_4_ = fVar50;
                    auVar11._12_4_ = fVar51;
                    auVar41 = rcpps(auVar38,auVar11);
                    fVar52 = auVar41._0_4_;
                    fVar53 = auVar41._4_4_;
                    fVar54 = auVar41._8_4_;
                    fVar55 = auVar41._12_4_;
                    auVar41._0_4_ =
                         fVar36 * (fVar52 + fVar52 + -1.0 +
                                  (2.0 - fVar46 * (fVar52 + fVar52)) * fVar52);
                    auVar41._4_4_ =
                         fVar47 * (fVar53 + fVar53 + -1.0 +
                                  (2.0 - fVar48 * (fVar53 + fVar53)) * fVar53);
                    auVar41._8_4_ =
                         fVar43 * (fVar54 + fVar54 + -1.0 +
                                  (2.0 - fVar50 * (fVar54 + fVar54)) * fVar54);
                    auVar41._12_4_ =
                         fVar49 * (fVar55 + fVar55 + -1.0 +
                                  (2.0 - fVar51 * (fVar55 + fVar55)) * fVar55);
                    break;
                  case 6:
                    fVar52 = **(float **)(&this->field_0x118 + (long)p_Var23);
                    fVar53 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
                    auVar42._0_4_ = fVar52 * fVar36 + fVar53;
                    auVar42._4_4_ = fVar52 * fVar47 + fVar53;
                    auVar42._8_4_ = fVar52 * fVar43 + fVar53;
                    auVar42._12_4_ = fVar52 * fVar49 + fVar53;
                    auVar41 = maxps(auVar42,ZEXT816(0));
                    auVar42 = minps(auVar41,auVar14);
                    auVar41._0_4_ = fVar36 * auVar42._0_4_;
                    auVar41._4_4_ = fVar47 * auVar42._4_4_;
                    auVar41._8_4_ = fVar43 * auVar42._8_4_;
                    auVar41._12_4_ = fVar49 * auVar42._12_4_;
                  }
                  *(undefined1 (*) [16])((long)pvVar25 + uVar24 * 0x10) = auVar41;
                  uVar24 = uVar24 + 1;
                } while (uVar24 != _w);
              }
              pvVar25 = (void *)((long)pvVar25 + (long)(int)(_w * 4) * 4);
              bVar31 = iVar22 != iVar30;
              iVar22 = iVar22 + 1;
            } while (bVar31);
          }
          local_238 = local_238 + 1;
          iVar17 = iVar17 + local_1ac;
        } while (local_238 != local_1b8);
      }
      if (local_158.data != (void *)0x0) {
        operator_delete(local_158.data,local_158.elemsize - (long)local_158.data);
      }
LAB_003cd82c:
      iVar26 = 0;
      goto LAB_003cd901;
    }
  }
LAB_003ccc02:
  uVar19 = iVar18 / iVar4;
  uVar20 = iVar22 / iVar4;
  local_250 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    local_250 = (uint)((uVar19 & 3) == 0) * 3 + 1;
    _elempack = (uint)((uVar20 & 3) == 0) * 3 + 1;
  }
  local_158.refcount = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  local_158.data = local_1a8.data;
  local_158.elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
  local_158.elempack = local_1a8.elempack;
  local_158.allocator = local_1a8.allocator;
  local_158.w = local_1a8.w;
  local_158.dims = local_1a8.dims;
  local_158.d = local_1a8.d;
  local_158.h = local_1a8.h;
  local_158.c = local_1a8.c;
  local_158.cstep = local_1a8.cstep;
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + 1;
    UNLOCK();
  }
  if (local_250 < iVar17) {
    local_208.data = *(void **)opt;
    local_208.elemsize = (size_t)opt->workspace_allocator;
    local_208.elempack = opt->openmp_blocktime;
    local_208._28_1_ = opt->use_winograd_convolution;
    local_208._29_1_ = opt->use_sgemm_convolution;
    local_208._30_1_ = opt->use_int8_inference;
    local_208._31_1_ = opt->use_vulkan_compute;
    local_208.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_208._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_208._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_208._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_208.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_1a8,&local_158,local_250,(Option *)&local_208);
  }
  local_208.data = top_blob->data;
  local_208.refcount = top_blob->refcount;
  local_208.elemsize = top_blob->elemsize;
  local_208.elempack = top_blob->elempack;
  local_208.allocator = top_blob->allocator;
  local_208.dims = top_blob->dims;
  local_208.w = top_blob->w;
  local_208.h = top_blob->h;
  local_208.d = top_blob->d;
  local_208.c = top_blob->c;
  local_208.cstep = top_blob->cstep;
  if (local_208.refcount != (int *)0x0) {
    LOCK();
    *local_208.refcount = *local_208.refcount + 1;
    UNLOCK();
  }
  pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
  if (_elempack < uVar28) {
    Mat::create(&local_208,_w,iVar30 + 1,
                *(int *)(&this->field_0xd0 + (long)pp_Var21[-3]) / (int)_elempack,
                (ulong)_elempack * ((ulong)_elemsize >> bVar16 * '\x02'),_elempack,
                opt->workspace_allocator);
    iVar26 = -100;
    if ((local_208.data != (void *)0x0) && ((long)local_208.c * local_208.cstep != 0)) {
      pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
      goto LAB_003ccdef;
    }
  }
  else {
LAB_003ccdef:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var21[-3])) {
      iVar30 = 0;
      iVar17 = 0;
      lVar29 = 0;
      do {
        local_c0 = (pointer)((long)(iVar30 / local_250) * local_158.cstep * local_158.elemsize +
                            (long)local_158.data);
        local_b8 = (int *)0x0;
        local_b0 = local_158.elemsize;
        local_a8 = local_158.elempack;
        local_a0 = local_158.allocator;
        local_94 = local_158.w;
        local_90 = local_158.h;
        local_8c = local_158.d;
        local_80 = ((long)local_158.d * local_158.elemsize * (long)local_158.h * (long)local_158.w +
                    0xf & 0xfffffffffffffff0) / local_158.elemsize;
        local_98 = local_158.dims;
        local_108 = (void *)((long)(iVar17 / (int)_elempack) * local_208.cstep * local_208.elemsize
                            + (long)local_208.data);
        local_100 = (int *)0x0;
        local_f8 = local_208.elemsize;
        local_f0 = local_208.elempack;
        local_e8 = local_208.allocator;
        local_dc = local_208.w;
        local_d8 = local_208.h;
        local_d4 = local_208.d;
        local_c8 = ((long)local_208.d * local_208.elemsize * (long)local_208.h * (long)local_208.w +
                    0xf & 0xfffffffffffffff0) / local_208.elemsize;
        local_e0 = local_208.dims;
        pLVar6 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar29];
        local_78 = *(undefined4 *)opt;
        iStack_74 = opt->num_threads;
        local_68 = *(undefined4 *)&opt->workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        iStack_60 = opt->openmp_blocktime;
        uStack_5c._0_1_ = opt->use_winograd_convolution;
        uStack_5c._1_1_ = opt->use_sgemm_convolution;
        uStack_5c._2_1_ = opt->use_int8_inference;
        uStack_5c._3_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        local_48 = opt->flush_denormals;
        uStack_44._0_1_ = opt->use_local_pool_allocator;
        uStack_44._1_1_ = opt->use_shader_local_memory;
        uStack_44._2_1_ = opt->use_cooperative_matrix;
        uStack_44._3_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_3c._0_1_ = opt->use_reserved_8;
        uStack_3c._1_1_ = opt->use_reserved_9;
        uStack_3c._2_1_ = opt->use_reserved_10;
        uStack_3c._3_1_ = opt->use_reserved_11;
        pAStack_70 = local_208.allocator;
        local_d0 = (int)uVar20 / (int)_elempack;
        local_88 = (int)uVar19 / local_250;
        (*pLVar6->_vptr_Layer[7])(pLVar6,&local_c0,&local_108);
        if (local_100 != (int *)0x0) {
          LOCK();
          *local_100 = *local_100 + -1;
          UNLOCK();
          if (*local_100 == 0) {
            if (local_e8 == (Allocator *)0x0) {
              if (local_108 != (void *)0x0) {
                free(local_108);
              }
            }
            else {
              (*local_e8->_vptr_Allocator[3])();
            }
          }
        }
        if (local_b8 != (int *)0x0) {
          LOCK();
          *local_b8 = *local_b8 + -1;
          UNLOCK();
          if (*local_b8 == 0) {
            if (local_a0 == (Allocator *)0x0) {
              if (local_c0 != (pointer)0x0) {
                free(local_c0);
              }
            }
            else {
              (*local_a0->_vptr_Allocator[3])();
            }
          }
        }
        lVar29 = lVar29 + 1;
        iVar17 = iVar17 + uVar20;
        iVar30 = iVar30 + uVar19;
      } while (lVar29 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                ));
    }
    if (_elempack < uVar28) {
      convert_packing(&local_208,top_blob,uVar28,opt);
      iVar26 = 0;
    }
    else {
      iVar26 = 0;
      if (&local_208 != top_blob) {
        if (local_208.refcount != (int *)0x0) {
          LOCK();
          *local_208.refcount = *local_208.refcount + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar26 = 0;
        top_blob->data = local_208.data;
        top_blob->refcount = local_208.refcount;
        top_blob->elemsize = local_208.elemsize;
        top_blob->elempack = local_208.elempack;
        top_blob->allocator = local_208.allocator;
        top_blob->dims = local_208.dims;
        top_blob->w = local_208.w;
        top_blob->h = local_208.h;
        top_blob->d = local_208.d;
        top_blob->c = local_208.c;
        top_blob->cstep = local_208.cstep;
      }
    }
  }
  if (local_208.refcount != (int *)0x0) {
    LOCK();
    *local_208.refcount = *local_208.refcount + -1;
    UNLOCK();
    if (*local_208.refcount == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003cd901:
  piVar5 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}